

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_versions.cc
# Opt level: O0

bool bssl::set_version_bound(SSL_PROTOCOL_METHOD *method,uint16_t *out,uint16_t version)

{
  bool bVar1;
  uint16_t local_22;
  uint16_t *puStack_20;
  uint16_t version_local;
  uint16_t *out_local;
  SSL_PROTOCOL_METHOD *method_local;
  
  local_22 = version;
  puStack_20 = out;
  out_local = (uint16_t *)method;
  bVar1 = api_version_to_wire(&local_22,version);
  if ((bVar1) &&
     (bVar1 = ssl_method_supports_version((SSL_PROTOCOL_METHOD *)out_local,local_22), bVar1)) {
    *puStack_20 = local_22;
    method_local._7_1_ = true;
  }
  else {
    ERR_put_error(0x10,0,0xea,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_versions.cc"
                  ,0x89);
    method_local._7_1_ = false;
  }
  return method_local._7_1_;
}

Assistant:

static bool set_version_bound(const SSL_PROTOCOL_METHOD *method, uint16_t *out,
                              uint16_t version) {
  if (!api_version_to_wire(&version, version) ||
      !ssl_method_supports_version(method, version)) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_UNKNOWN_SSL_VERSION);
    return false;
  }

  *out = version;
  return true;
}